

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
PeleLM::getForce(PeleLM *this,FArrayBox *force,Box *bx,int scomp,int ncomp,Real time,FArrayBox *Vel,
                FArrayBox *Scal,int scalScomp,MFIter *mfi)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  double *pdVar15;
  Box bx_00;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Real RVar19;
  int iVar20;
  Real RVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int *piVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  bool bVar51;
  double dVar52;
  int iVar54;
  undefined1 auVar53 [16];
  long lVar56;
  undefined1 auVar55 [16];
  int iVar58;
  undefined1 auVar57 [16];
  undefined4 local_4c;
  undefined4 uStack_48;
  
  RVar21 = NavierStokesBase::gravity;
  iVar20 = ctrl_pseudoGravity;
  RVar19 = ctrl_dV;
  auVar18 = _DAT_0077bb40;
  auVar17 = _DAT_0077bb30;
  iVar2 = (bx->smallend).vect[2];
  iVar3 = (bx->bigend).vect[2];
  if (iVar2 <= iVar3) {
    iVar4 = (Scal->super_BaseFab<double>).domain.smallend.vect[0];
    iVar5 = (Scal->super_BaseFab<double>).domain.smallend.vect[1];
    iVar6 = (Scal->super_BaseFab<double>).domain.smallend.vect[2];
    lVar34 = (long)(((Scal->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
    lVar38 = (((Scal->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1) * lVar34;
    lVar35 = (long)(((Scal->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1) *
             (long)scalScomp * lVar38;
    pdVar14 = (Scal->super_BaseFab<double>).dptr;
    iVar7 = (force->super_BaseFab<double>).domain.smallend.vect[0];
    iVar8 = (force->super_BaseFab<double>).domain.smallend.vect[1];
    iVar9 = (force->super_BaseFab<double>).domain.smallend.vect[2];
    lVar48 = (long)iVar9;
    lVar22 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[0] - iVar7) + 1);
    lVar28 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[1] - iVar8) + 1);
    lVar23 = (long)(((force->super_BaseFab<double>).domain.bigend.vect[2] - iVar9) + 1);
    lVar45 = lVar28 * lVar22 * lVar23;
    lVar39 = (long)scomp;
    lVar40 = lVar45 * lVar39;
    uVar36 = 3;
    if (3 < scomp) {
      uVar36 = (ulong)(uint)scomp;
    }
    lVar29 = (uint)(ncomp + scomp) - uVar36;
    lVar30 = lVar29 + -1;
    iVar10 = (bx->smallend).vect[0];
    lVar37 = (long)iVar10 * 8 + (long)iVar7 * -8;
    pdVar15 = (force->super_BaseFab<double>).dptr;
    dVar52 = ABS(NavierStokesBase::gravity);
    auVar53._8_4_ = (int)lVar30;
    auVar53._0_8_ = lVar30;
    auVar53._12_4_ = (int)((ulong)lVar30 >> 0x20);
    lVar30 = (long)iVar8 * -8;
    auVar53 = auVar53 ^ _DAT_0077bb40;
    iVar11 = (bx->smallend).vect[1];
    iVar12 = (bx->bigend).vect[0];
    iVar13 = (bx->bigend).vect[1];
    do {
      if (iVar11 <= iVar13) {
        lVar24 = (long)iVar2;
        lVar31 = (long)(iVar2 - iVar9) * lVar28 * lVar22;
        lVar25 = (iVar2 - iVar6) * lVar38;
        iVar16 = iVar11;
        do {
          if (iVar10 <= iVar12) {
            lVar32 = (long)iVar16;
            lVar46 = (long)pdVar15 +
                     (((uVar36 * 8 + lVar39 * 8) * lVar23 + lVar48 * -8 + lVar24 * 8) * lVar28 +
                      lVar30 + lVar32 * 8) * lVar22 + lVar37;
            lVar26 = (long)pdVar15 +
                     (((uVar36 * 8 + lVar39 * 8 + 8) * lVar23 + lVar48 * -8 + lVar24 * 8) * lVar28 +
                      lVar30 + lVar32 * 8) * lVar22 + lVar37;
            lVar41 = (long)pdVar15 +
                     (((lVar39 * 8 + 8) * lVar23 + lVar48 * -8 + lVar24 * 8) * lVar28 + lVar30 +
                     lVar32 * 8) * lVar22 + lVar37;
            lVar42 = (long)pdVar15 +
                     ((lVar39 * lVar23 * 8 + lVar48 * -8 + lVar24 * 8) * lVar28 + lVar30 +
                     lVar32 * 8) * lVar22 + lVar37;
            lVar43 = (iVar16 - iVar8) * lVar22;
            lVar33 = (iVar16 - iVar5) * lVar34;
            lVar32 = (long)iVar10;
            do {
              if (scomp == 0) {
                lVar44 = lVar32 - iVar7;
                if (dVar52 <= 0.0001) {
                  lVar49 = 4;
                  lVar47 = 0;
                  auVar55 = auVar17;
                  do {
                    auVar57 = auVar55 ^ auVar18;
                    if (auVar57._4_4_ == -0x80000000 && auVar57._0_4_ < -0x7ffffffd) {
                      *(undefined8 *)(lVar42 + lVar47) = 0;
                      *(undefined8 *)(lVar41 + lVar47) = 0;
                    }
                    lVar56 = auVar55._8_8_;
                    auVar55._0_8_ = auVar55._0_8_ + 2;
                    auVar55._8_8_ = lVar56 + 2;
                    lVar47 = lVar47 + lVar45 * 0x10;
                    lVar49 = lVar49 + -2;
                  } while (lVar49 != 0);
                }
                else {
                  pdVar1 = pdVar15 + lVar40 + lVar31 + lVar43 + lVar44;
                  *pdVar1 = 0.0;
                  pdVar1[lVar45] = 0.0;
                  pdVar1[lVar45 * 2] = pdVar14[lVar35 + lVar25 + lVar33 + (lVar32 - iVar4)] * RVar21
                  ;
                }
                if (iVar20 != 0) {
                  pdVar15[lVar40 + lVar31 + lVar43 + lVar45 * 2 + lVar44] =
                       pdVar14[lVar35 + lVar25 + lVar33 + (lVar32 - iVar4)] * RVar19 +
                       pdVar15[lVar40 + lVar31 + lVar43 + lVar45 * 2 + lVar44];
                }
              }
              if ((int)uVar36 < ncomp + scomp) {
                lVar44 = 0;
                uVar50 = 0;
                do {
                  auVar57._8_4_ = (int)uVar50;
                  auVar57._0_8_ = uVar50;
                  auVar57._12_4_ = (int)(uVar50 >> 0x20);
                  auVar55 = (auVar57 | auVar17) ^ auVar18;
                  bVar51 = auVar53._0_4_ < auVar55._0_4_;
                  iVar54 = auVar53._4_4_;
                  iVar58 = auVar55._4_4_;
                  if ((bool)(~(iVar54 < iVar58 || iVar58 == iVar54 && bVar51) & 1)) {
                    *(undefined8 *)(lVar46 + lVar44) = 0;
                  }
                  if (iVar54 >= iVar58 && (iVar58 != iVar54 || !bVar51)) {
                    *(undefined8 *)(lVar26 + lVar44) = 0;
                  }
                  uVar50 = uVar50 + 2;
                  lVar44 = lVar44 + lVar45 * 0x10;
                } while ((lVar29 + 1U & 0xfffffffffffffffe) != uVar50);
              }
              lVar32 = lVar32 + 1;
              lVar41 = lVar41 + 8;
              lVar42 = lVar42 + 8;
              lVar46 = lVar46 + 8;
              lVar26 = lVar26 + 8;
            } while (iVar12 + 1 != (int)lVar32);
          }
          bVar51 = iVar16 != iVar13;
          iVar16 = iVar16 + 1;
        } while (bVar51);
      }
      bVar51 = iVar2 != iVar3;
      iVar2 = iVar2 + 1;
    } while (bVar51);
  }
  if (scomp == 0 && ncomp == 3) {
    piVar27 = &mfi->currentIndex;
    if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar27 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + *piVar27;
    }
    uStack_48 = (undefined4)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
    local_4c = (undefined4)((ulong)*(undefined8 *)((bx->smallend).vect + 2) >> 0x20);
    bx_00.bigend.vect[0] = local_4c;
    bx_00.smallend.vect = (int  [3])*(undefined1 (*) [12])(bx->smallend).vect;
    bx_00.bigend.vect[1] = uStack_48;
    bx_00._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
    amrex::BaseFab<double>::plus<(amrex::RunOn)0>
              (&force->super_BaseFab<double>,
               &(this->external_sources).super_FabArray<amrex::FArrayBox>.m_fabs_v.
                super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar27]->super_BaseFab<double>,bx_00,(SrcComp)0x0
               ,(DestComp)0x0,(NumComps)0x3);
  }
  return;
}

Assistant:

void
PeleLM::getForce(FArrayBox&       force,
                 const Box&       bx,
                 int              scomp,
                 int              ncomp,
                 const Real       time,
                 const FArrayBox& Vel,
                 const FArrayBox& Scal,
                 int              scalScomp,
                 const MFIter&    mfi)
{
   AMREX_ASSERT(force.box().contains(bx));

   const auto& velocity = Vel.array();
   const auto& scalars  = Scal.array(scalScomp);
   const auto& f        = force.array(scomp);

   const auto  dx       = geom.CellSizeArray();
   const Real  grav     = gravity;

   // Get non-static info for the pseudo gravity forcing
   int pseudo_gravity    = ctrl_pseudoGravity;
   const Real dV_control = ctrl_dV;

   amrex::ParallelFor(bx, [f, scalars, velocity, time, grav, pseudo_gravity, dV_control, dx, scomp, ncomp]
   AMREX_GPU_DEVICE(int i, int j, int k) noexcept
   {
      makeForce(i,j,k, scomp, ncomp, pseudo_gravity, time, grav, dV_control, dx, velocity, scalars, f);
   });
   // Velocity forcing
   if (scomp == Xvel && ncomp == AMREX_SPACEDIM) {
     const FArrayBox& ext_force = external_sources[mfi];
     force.plus<RunOn::Device>(ext_force, bx, Xvel, Xvel, AMREX_SPACEDIM);
   }
}